

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O1

void flatbuffers::tests::UnicodeTestAllowNonUTF8(void)

{
  bool expval;
  uint8_t *flatbuffer;
  char *pcVar1;
  string jsongen;
  Parser parser;
  undefined1 local_aa0 [784];
  Parser local_790;
  
  IDLOptions::IDLOptions((IDLOptions *)local_aa0);
  Parser::Parser(&local_790,(IDLOptions *)local_aa0);
  IDLOptions::~IDLOptions((IDLOptions *)local_aa0);
  local_790.opts.allow_non_utf8 = true;
  expval = Parser::Parse(&local_790,
                         "table T { F:string; }root_type T;{ F:\"\\u20AC\\u00A2\\u30E6\\u30FC\\u30B6\\u30FC\\u5225\\u30B5\\u30A4\\u30C8\\x01\\x80\\u0080\\uD83D\\uDE0E\" }"
                         ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(expval,true,
                    "\'parser.Parse( \"table T { F:string; }\" \"root_type T;\" \"{ F:\\\"\\\\u20AC\\\\u00A2\\\\u30E6\\\\u30FC\\\\u30B6\\\\u30FC\" \"\\\\u5225\\\\u30B5\\\\u30A4\\\\u30C8\\\\x01\\\\x80\\\\u0080\\\\uD83D\\\\uDE0E\\\" }\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x2f6,"");
  local_aa0._8_8_ = 0;
  local_aa0[0x10] = false;
  local_790.opts.indent_step = -1;
  local_aa0._0_8_ = local_aa0 + 0x10;
  flatbuffer = FlatBufferBuilderImpl<false>::GetBufferPointer(&local_790.builder_);
  pcVar1 = GenText(&local_790,flatbuffer,(string *)local_aa0);
  TestEq<bool,bool>(true,pcVar1 == (char *)0x0,"\'nullptr\' != \'result\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x2fa,"");
  TestEqStr((char *)local_aa0._0_8_,
            "{F: \"\\u20AC\\u00A2\\u30E6\\u30FC\\u30B6\\u30FC\\u5225\\u30B5\\u30A4\\u30C8\\u0001\\x80\\u0080\\uD83D\\uDE0E\"}"
            ,
            "\'jsongen.c_str()\' != \'\"{F: \\\"\\\\u20AC\\\\u00A2\\\\u30E6\\\\u30FC\\\\u30B6\\\\u30FC\" \"\\\\u5225\\\\u30B5\\\\u30A4\\\\u30C8\\\\u0001\\\\x80\\\\u0080\\\\uD83D\\\\uDE0E\\\"}\"\'"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
            ,0x2fe,"");
  if ((undefined1 *)local_aa0._0_8_ != local_aa0 + 0x10) {
    operator_delete((void *)local_aa0._0_8_,CONCAT71(local_aa0._17_7_,local_aa0[0x10]) + 1);
  }
  Parser::~Parser(&local_790);
  return;
}

Assistant:

void UnicodeTestAllowNonUTF8() {
  flatbuffers::Parser parser;
  parser.opts.allow_non_utf8 = true;
  TEST_EQ(
      parser.Parse(
          "table T { F:string; }"
          "root_type T;"
          "{ F:\"\\u20AC\\u00A2\\u30E6\\u30FC\\u30B6\\u30FC"
          "\\u5225\\u30B5\\u30A4\\u30C8\\x01\\x80\\u0080\\uD83D\\uDE0E\" }"),
      true);
  std::string jsongen;
  parser.opts.indent_step = -1;
  auto result = GenText(parser, parser.builder_.GetBufferPointer(), &jsongen);
  TEST_NULL(result);
  TEST_EQ_STR(
      jsongen.c_str(),
      "{F: \"\\u20AC\\u00A2\\u30E6\\u30FC\\u30B6\\u30FC"
      "\\u5225\\u30B5\\u30A4\\u30C8\\u0001\\x80\\u0080\\uD83D\\uDE0E\"}");
}